

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VectorIO.cpp
# Opt level: O0

void amrex::readLongData(Long *data,size_t size,istream *is,IntDescriptor *id)

{
  bool bVar1;
  int iVar2;
  IntDescriptor *id_00;
  IntDescriptor *in_RCX;
  istream *in_RDX;
  size_t in_RSI;
  long *in_RDI;
  IntDescriptor *in_stack_ffffffffffffffc8;
  IntDescriptor *this;
  
  this = in_RCX;
  id_00 = FPC::NativeLongDescriptor();
  bVar1 = IntDescriptor::operator==(in_RCX,id_00);
  if (bVar1) {
    IntDescriptor::numBytes(this);
    std::istream::read((char *)in_RDX,(long)in_RDI);
  }
  else {
    iVar2 = IntDescriptor::numBytes(this);
    if (iVar2 == 2) {
      readIntData<long,short>
                ((long *)in_RDX,(size_t)this,(istream *)in_RCX,in_stack_ffffffffffffffc8);
    }
    else {
      iVar2 = IntDescriptor::numBytes(this);
      if (iVar2 == 4) {
        readIntData<long,int>
                  ((long *)in_RDX,(size_t)this,(istream *)in_RCX,in_stack_ffffffffffffffc8);
      }
      else {
        iVar2 = IntDescriptor::numBytes(this);
        if (iVar2 == 8) {
          readIntData<long,long>(in_RDI,in_RSI,in_RDX,this);
        }
        else {
          Error_host((char *)in_RCX);
        }
      }
    }
  }
  return;
}

Assistant:

void amrex::readLongData (Long* data, std::size_t size, std::istream& is,
                          const IntDescriptor& id)
{
    if (id == FPC::NativeLongDescriptor())
    {
        is.read((char*) data, size * id.numBytes());
    }
    else if (id.numBytes() == 2)
    {
        readIntData<Long, std::int16_t>(data, size, is, id);
    }
    else if (id.numBytes() == 4)
    {
        readIntData<Long, std::int32_t>(data, size, is, id);
    }
    else if (id.numBytes() == 8)
    {
        readIntData<Long, std::int64_t>(data, size, is, id);
    }
    else {
        amrex::Error("Don't know how to work with this long type.");
    }
}